

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.hpp
# Opt level: O2

lane<long_double> *
re::simd::lane_transform<long_double,re::simd::intrinsics::add<long_double>>
          (long a,undefined8 b,lane<long_double> *output)

{
  std::
  transform<long_double_const*,long_double_const*,long_double*,re::simd::intrinsics::add<long_double>>
            (a,a + 0x10,b,output);
  return output;
}

Assistant:

lane<T>& lane_transform(
    lane<T> const& a,
    lane<T> const& b,
    lane<T>& output,
    BinaryOp op
) {
    std::transform(
        std::cbegin(a.a),
        std::cend(a.a),
        std::cbegin(b.a),
        std::begin(output.a),
        op
    );
    return output;
}